

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionEulerAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  dVar5 = mW->m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar5;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->My;
  dVar1 = mW->m_data[1];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->Mz;
  dVar2 = mW->m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = this->My * dVar5;
  auVar9 = vfmsub231sd_fma(auVar19,auVar14,auVar9);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = this->Mz * dVar2;
  auVar4 = vfmsub231sd_fma(auVar16,auVar6,ZEXT816(0) << 0x40);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * -0.0;
  auVar8 = vfmadd231sd_fma(auVar20,auVar12,auVar18);
  dVar3 = this->mu;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar9._0_8_ * dVar1;
  auVar10 = vfmsub231sd_fma(auVar10,auVar12,auVar4);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar8._0_8_ * dVar2;
  auVar9 = vfmsub231sd_fma(auVar13,auVar6,auVar9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar4._0_8_ * dVar5;
  auVar8 = vfmsub231sd_fma(auVar7,auVar14,auVar8);
  dVar5 = dVar3 * auVar8._0_8_;
  mF->m_data[0] = dVar5;
  mF->m_data[1] = dVar3 * auVar9._0_8_;
  mF->m_data[2] = dVar3 * auVar10._0_8_;
  (*(this->super_ChBeamSectionEuler).super_ChBeamSection._vptr_ChBeamSection[0xc])();
  auVar11._8_8_ = 0;
  auVar11._0_8_ = mW->m_data[0];
  dVar5 = dVar5 * mW->m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar5 * SUB168(*(undefined1 (*) [16])(mW->m_data + 1),0);
  auVar9 = vfmsub231sd_fma(auVar15,auVar11,ZEXT816(0));
  auVar17._8_8_ = mW->m_data[2];
  auVar17._0_8_ = mW->m_data[2];
  auVar8 = vunpcklpd_avx(auVar17,auVar11);
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vmulpd_avx512vl(auVar8,auVar4);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar5;
  auVar8 = vunpcklpd_avx(ZEXT816(0),auVar8);
  auVar8 = vfmadd213pd_fma(auVar8,*(undefined1 (*) [16])(mW->m_data + 1),auVar4);
  *(undefined1 (*) [16])mT->m_data = auVar8;
  mT->m_data[2] = auVar9._0_8_;
  return;
}

Assistant:

void ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		// F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,My,Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 8 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									0,
									0 )  );
	}